

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O0

void __thiscall TextEntry::maybe_scroll(TextEntry *this)

{
  int iVar1;
  Theme *pTVar2;
  ALLEGRO_USTR *pAVar3;
  ALLEGRO_USTR *in_RDI;
  int tw;
  Theme *theme;
  ALLEGRO_FONT *pAVar4;
  UString *in_stack_ffffffffffffffd0;
  
  pTVar2 = Dialog::get_theme((Dialog *)in_RDI[1].data);
  if (in_RDI[4].slen < *(int *)&in_RDI[4].data + 3) {
    if (in_RDI[4].slen < 3) {
      *(undefined4 *)&in_RDI[4].data = 0;
    }
    else {
      *(int *)&in_RDI[4].data = in_RDI[4].slen + -3;
    }
  }
  else {
    while( true ) {
      pAVar4 = pTVar2->font;
      anon_unknown.dwarf_7602::UString::UString
                (in_stack_ffffffffffffffd0,in_RDI,(int)((ulong)pAVar4 >> 0x20),(int)pAVar4);
      pAVar3 = (anonymous_namespace)::UString::operator_cast_to__al_tagbstring_
                         ((UString *)&stack0xffffffffffffffd0);
      iVar1 = al_get_ustr_width(pAVar4,pAVar3);
      if (in_RDI[2].mlen + iVar1 + 8 < *(int *)&in_RDI[2].data) break;
      al_ustr_next(in_RDI[3].data,&in_RDI[4].data);
    }
  }
  return;
}

Assistant:

void TextEntry::maybe_scroll()
{
   const Theme & theme = dialog->get_theme();

   if (cursor_pos < left_pos + 3) {
      if (cursor_pos < 3)
         left_pos = 0;
      else
         left_pos = cursor_pos - 3;
   }
   else {
      for (;;) {
         const int tw = al_get_ustr_width(theme.font,
            UString(text, left_pos, cursor_pos));
         if (x1 + tw + CURSOR_WIDTH < x2) {
            break;
         }
         al_ustr_next(text, &left_pos);
      }
   }
}